

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O2

boolean artifact_hit(monst *magr,monst *mdef,obj *otmp,obj *ostack,boolean thrown,int *dmgptr,
                    int dieroll)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  boolean bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  obj **ppoVar9;
  char *pcVar10;
  obj *poVar11;
  size_t sVar12;
  char *pcVar13;
  int *piVar14;
  bool bVar15;
  monst *mtmp;
  undefined8 uVar16;
  byte bVar17;
  uint uVar18;
  obj *olaunch;
  uint uVar19;
  char *pcVar20;
  bool youattack;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  char *local_490;
  char hittee_1 [256];
  char hittee [256];
  char wepbuf [256];
  char local_138 [264];
  
  youattack = magr == &youmonst;
  if ((youattack == (magr != (monst *)0x0)) ||
     (bVar15 = true, (viz_array[magr->my][magr->mx] & 2U) == 0)) {
    if (mdef != &youmonst) {
      bVar15 = (bool)((viz_array[mdef->my][mdef->mx] & 2U) >> 1);
      if ((magr == &youmonst) && ((viz_array[mdef->my][mdef->mx] & 2U) == 0)) goto LAB_0014c3f6;
      goto LAB_0014c456;
    }
    if (magr == &youmonst) {
LAB_0014c3f6:
      bVar15 = false;
      if (((u._1052_1_ & 1) == 0) || (u.ustuck != mdef)) goto LAB_0014c456;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          bVar15 = true;
          if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0014c456;
          goto LAB_0014c424;
        }
      }
      else {
LAB_0014c424:
        if (ublindf == (obj *)0x0) {
          bVar15 = false;
          goto LAB_0014c456;
        }
      }
      bVar15 = ublindf->oartifact == '\x1d';
      goto LAB_0014c456;
    }
    bVar15 = false;
    if (thrown != '\0') goto LAB_0014c464;
    bVar15 = false;
LAB_0014c4dc:
    olaunch = (obj *)0x0;
  }
  else {
LAB_0014c456:
    if (thrown == '\0') goto LAB_0014c4dc;
    if (magr == &youmonst) {
      ppoVar9 = &uwep;
    }
    else {
LAB_0014c464:
      if (magr == (monst *)0x0) goto LAB_0014c4dc;
      ppoVar9 = &magr->mw;
    }
    olaunch = *ppoVar9;
    if ((((((olaunch == (obj *)0x0) || (olaunch->oclass != '\x02')) ||
          (2 < (byte)(objects[olaunch->otyp].oc_subtyp - 0x16U))) ||
         ((otmp->oclass != '\r' && (otmp->oclass != '\x02')))) ||
        (2 < (byte)(objects[otmp->otyp].oc_subtyp + 0x18U))) ||
       ((int)objects[otmp->otyp].oc_subtyp != -(uint)(byte)objects[olaunch->otyp].oc_subtyp))
    goto LAB_0014c4dc;
  }
  if ((otmp->oartifact == '\0') && (bVar4 = oprop_attack(0xf,otmp,olaunch,thrown), bVar4 == '\0')) {
    return '\0';
  }
  pcVar20 = "The";
  if (magr == &youmonst) {
    pcVar20 = "Your";
  }
  pcVar10 = distant_name(otmp,xname);
  local_490 = wepbuf;
  snprintf(local_490,0x100,"%s %s",pcVar20,pcVar10);
  if (mdef == &youmonst) {
    pcVar10 = "you";
  }
  else {
    pcVar10 = mon_nam(mdef);
  }
  strcpy(hittee,pcVar10);
  iVar5 = spec_dbon(otmp,olaunch,thrown,mdef,*dmgptr);
  *dmgptr = *dmgptr + iVar5;
  if (magr == &youmonst && mdef == &youmonst) {
    warning("attacking yourself with weapon?");
    return '\0';
  }
  bVar21 = mdef == &youmonst;
  bVar22 = bVar15 != false;
  bVar2 = u.ustuck == mdef;
  bVar3 = magr == &youmonst;
  bVar4 = attacks(2,otmp,olaunch,thrown);
  if (bVar4 == '\0') {
    bVar23 = false;
  }
  else {
    local_490 = wepbuf;
    if (((bVar22 || bVar21) || bVar2 && bVar3) &&
       (otmp->oartifact != '\0' || spec_applies_ad_fire != '\0')) {
      if (otmp->oartifact == '\f') {
        local_490 = "The fiery blade";
      }
      if (spec_applies_ad_fire == '\0') {
        uVar16 = 0x2e;
        pcVar10 = "hits";
      }
      else {
        uVar16 = 0x21;
        pcVar10 = "burns";
        if (mdef->data == mons + 0xa2) {
          pcVar10 = "vaporizes part of";
        }
      }
      pline("%s %s %s%c",local_490,pcVar10,hittee,uVar16);
      bVar23 = true;
      if (spec_applies_ad_fire != '\0') {
        oprop_id(1,otmp,ostack,olaunch);
      }
    }
    else {
      bVar23 = false;
    }
    uVar6 = mt_random();
    if (((uVar6 & 3) == 0) &&
       (bVar4 = destroy_mitem(mdef,8,2,dmgptr),
       bVar4 != '\0' && ((bVar22 || bVar21) || bVar2 && bVar3))) {
      oprop_id(1,otmp,ostack,olaunch);
    }
    uVar6 = mt_random();
    if (((uVar6 & 3) == 0) &&
       (bVar4 = destroy_mitem(mdef,9,2,dmgptr),
       bVar4 != '\0' && ((bVar22 || bVar21) || bVar2 && bVar3))) {
      oprop_id(1,otmp,ostack,olaunch);
    }
    uVar6 = mt_random();
    if ((uVar6 % 7 == 0) &&
       (bVar4 = destroy_mitem(mdef,10,2,dmgptr),
       bVar4 != '\0' && ((bVar22 || bVar21) || bVar2 && bVar3))) {
      oprop_id(1,otmp,ostack,olaunch);
    }
    if ((mdef == &youmonst) && (u.uprops[0x3a].intrinsic != 0)) {
      burn_away_slime();
      oprop_id(1,otmp,ostack,olaunch);
    }
  }
  bVar4 = attacks(3,otmp,olaunch,thrown);
  if (bVar4 != '\0') {
    if (((bVar22 || bVar21) || bVar2 && bVar3) &&
       (otmp->oartifact != '\0' || spec_applies_ad_cold != '\0')) {
      if (otmp->oartifact == '\v') {
        local_490 = "The ice-cold blade";
      }
      pcVar10 = "freezes";
      if (spec_applies_ad_cold == '\0') {
        pcVar10 = "hits";
      }
      uVar16 = 0x21;
      if (spec_applies_ad_cold == '\0') {
        uVar16 = 0x2e;
      }
      pline("%s %s %s%c",local_490,pcVar10,hittee,uVar16);
      bVar23 = true;
      if (spec_applies_ad_cold != '\0') {
        oprop_id(2,otmp,ostack,olaunch);
      }
    }
    uVar6 = mt_random();
    if (((uVar6 & 3) == 0) &&
       (bVar4 = destroy_mitem(mdef,8,3,dmgptr),
       bVar4 != '\0' && ((bVar22 || bVar21) || bVar2 && bVar3))) {
      oprop_id(2,otmp,ostack,olaunch);
    }
  }
  bVar4 = attacks(6,otmp,olaunch,thrown);
  if (bVar4 != '\0') {
    if (((bVar22 || bVar21) || bVar2 && bVar3) &&
       (otmp->oartifact != '\0' || spec_applies_ad_elec != '\0')) {
      pcVar10 = "!  Lightning strikes";
      if (spec_applies_ad_elec == '\0') {
        pcVar10 = "";
      }
      uVar16 = 0x21;
      if (spec_applies_ad_elec == '\0') {
        uVar16 = 0x2e;
      }
      pline("The massive hammer hits%s %s%c",pcVar10,hittee,uVar16);
      bVar23 = true;
    }
    uVar6 = mt_random();
    if (uVar6 % 5 == 0) {
      destroy_mitem(mdef,0xb,6,dmgptr);
    }
  }
  bVar4 = attacks(1,otmp,olaunch,thrown);
  if ((bVar4 != '\0' && ((bVar22 || bVar21) || bVar2 && bVar3)) &&
     (otmp->oartifact != '\0' || spec_applies_ad_magm != '\0')) {
    pcVar10 = "!  A hail of magic missiles strikes";
    if (spec_applies_ad_magm == '\0') {
      pcVar10 = "";
    }
    uVar16 = 0x21;
    if (spec_applies_ad_magm == '\0') {
      uVar16 = 0x2e;
    }
    pline("The imaginary widget hits%s %s%c",pcVar10,hittee,uVar16);
    bVar23 = true;
  }
  bVar4 = attacks(0xc,otmp,olaunch,thrown);
  if ((dieroll < 9) && (bVar4 != '\0')) {
    bVar17 = otmp->spe;
    if ((char)bVar17 < '\x03') {
      uVar6 = 4;
    }
    else {
      uVar6 = 4 >> (bVar17 / 3 & 0x1f);
    }
    iVar5 = (uint)(spec_applies_ad_stun == '\0') + dieroll;
    if ((char)bVar17 < '\x01') {
      bVar17 = 0;
    }
    uVar7 = rn2((uint)(spec_applies_ad_stun != '\0') * 4 + 7);
    iVar8 = rnd(4);
    *dmgptr = *dmgptr + iVar8;
    uVar19 = (uint)bVar17;
    bVar23 = uVar19 <= uVar7 && uVar7 != bVar17;
    if (bVar23) {
      iVar8 = rnd(4);
      *dmgptr = *dmgptr + iVar8;
    }
    uVar18 = (uint)bVar23;
    if (iVar5 <= (int)uVar6) {
      iVar8 = rnd(4);
      *dmgptr = *dmgptr + iVar8;
      uVar18 = 2;
    }
    if (iVar5 <= (int)(uVar6 >> 1)) {
      iVar5 = rnd(4);
      *dmgptr = *dmgptr + iVar5;
      uVar18 = 3;
    }
    uVar6 = 0;
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        uVar6 = 1;
      }
      else {
        bVar4 = dmgtype(youmonst.data,0x24);
        uVar6 = (uint)(bVar4 == '\0');
      }
    }
    if (((magr == &youmonst || mdef == &youmonst) | bVar15) != 1) {
LAB_0014cb72:
      bVar4 = (*(code *)(&DAT_00287960 + *(int *)(&DAT_00287960 + (ulong)uVar18 * 4)))();
      return bVar4;
    }
    pcVar10 = vtense((char *)0x0,
                     *(char **)((long)mb_verb[0] + (ulong)uVar18 * 8 + (ulong)(uVar6 << 5)));
    pline("The magic-absorbing blade %s %s!",pcVar10,hittee);
    if (uVar18 != 0) goto LAB_0014cb72;
    if (mdef->wormno == '\0') {
      if ((viz_array[mdef->my][mdef->mx] & 2U) != 0) goto LAB_0014cf29;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014cd2b;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014cd22;
      }
      else {
LAB_0014cd22:
        if (ublindf == (obj *)0x0) goto LAB_0014cf8a;
LAB_0014cd2b:
        if (ublindf->oartifact != '\x1d') goto LAB_0014cf8a;
      }
      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mdef->my][mdef->mx] & 1U) != 0)
          ) && ((mdef->data->mflags3 & 0x200) != 0)) goto LAB_0014cf29;
LAB_0014cf8a:
      if (((mdef->data->mflags1 & 0x10000) == 0) &&
         ((poVar11 = which_armor(mdef,4), poVar11 == (obj *)0x0 ||
          (poVar11 = which_armor(mdef,4), poVar11->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014cfe1;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014cfdc;
        }
        else {
LAB_0014cfdc:
          if (ublindf != (obj *)0x0) {
LAB_0014cfe1:
            if (ublindf->oartifact == '\x1d') goto LAB_0014d086;
          }
          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0014d11e;
        }
LAB_0014d086:
        if ((u.uprops[0x19].extrinsic != 0) &&
           ((u.uprops[0x19].blocked == 0 &&
            (iVar5 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), iVar5 < 0x41))))
        goto LAB_0014d11e;
      }
      if ((u.uprops[0x42].intrinsic == 0) &&
         ((u.uprops[0x42].extrinsic == 0 && (bVar4 = match_warn_of_mon(mdef), bVar4 == '\0')))) {
        map_invisible(mdef->mx,mdef->my);
      }
    }
    else {
      bVar4 = worm_known(level,mdef);
      if (bVar4 == '\0') goto LAB_0014cf8a;
LAB_0014cf29:
      uVar6 = *(uint *)&mdef->field_0x60;
      if ((((uVar6 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_0014cf73;
        goto LAB_0014cf8a;
      }
      if ((uVar6 & 0x280) != 0) goto LAB_0014cf8a;
LAB_0014cf73:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_0014cf8a;
    }
LAB_0014d11e:
    if ((magr == &youmonst) &&
       ((bVar17 = otmp->spe, bVar17 == 0 ||
        (bVar17 = (bVar17 ^ (char)bVar17 >> 7) - ((char)bVar17 >> 7),
        iVar5 = rn2((uint)bVar17 + (uint)bVar17 * 2), iVar5 == 0)))) {
      bVar17 = 0;
      pline("The %s is insightful.");
      probe_monster(mdef);
      bVar15 = true;
      if (uVar19 < uVar7) {
LAB_0014d142:
        if (mdef == &youmonst) {
          make_stunned((ulong)(u.uprops[0x1b].intrinsic + 3),'\0');
        }
        else {
          mdef->field_0x62 = mdef->field_0x62 | 0x10;
        }
        bVar15 = false;
        bVar17 = 1;
      }
    }
    else {
      if (uVar19 < uVar7) goto LAB_0014d142;
      bVar15 = true;
      bVar17 = 0;
    }
    uVar6 = mt_random();
    uVar6 = uVar6 % 0xc;
    if (uVar6 == 0) {
      if (mdef == &youmonst) {
        make_confused((ulong)(u.uprops[0x1c].intrinsic + 4),'\0');
      }
      else {
        mdef->field_0x62 = mdef->field_0x62 | 0x20;
      }
    }
    upstart(hittee);
    if ((!(bool)(~bVar17 & uVar6 != 0)) && (flags.verbose != '\0')) {
      hittee_1[0] = '\0';
      if (!bVar15) {
        sVar12 = strlen(hittee_1);
        builtin_strncpy(hittee_1 + sVar12,"stunned",8);
      }
      bVar15 = (bool)(bVar17 & uVar6 == 0);
      if (bVar15) {
        sVar12 = strlen(hittee_1);
        builtin_strncpy(hittee_1 + sVar12," and ",6);
LAB_0014d326:
        sVar12 = strlen(hittee_1);
        builtin_strncpy(hittee_1 + sVar12,"confused",9);
      }
      else if (uVar6 == 0) goto LAB_0014d326;
      pcVar10 = vtense(hittee,"are");
      uVar16 = 0x2e;
      if (bVar15) {
        uVar16 = 0x21;
      }
      pline("%s %s %s%c",hittee,pcVar10,hittee_1,uVar16);
    }
    bVar23 = true;
  }
  cVar1 = otmp->oartifact;
  if ((((mdef != &youmonst || cVar1 != '\x04') && (spec_dbon_applies == 0)) &&
      (spec_applies_ad_drli == '\0')) && (spec_applies_spfx_behead == '\0')) {
    return bVar23;
  }
  if ((spec_applies_ad_drli != '\0') &&
     ((bVar4 = spec_ability(otmp,0x100), bVar4 != '\0' ||
      (bVar4 = oprop_attack(4,otmp,olaunch,thrown), bVar4 != '\0')))) {
    iVar5 = u.uhpmax;
    if ((magr == &youmonst || magr == (monst *)0x0) ||
       (bVar15 = true, (viz_array[magr->my][magr->mx] & 2U) == 0)) {
      if (mdef == &youmonst) {
        if (magr == &youmonst) {
LAB_0014d4b8:
          bVar15 = false;
          if (((u._1052_1_ & 1) == 0) || (u.ustuck != mdef)) goto LAB_0014d523;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
              bVar15 = true;
              if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0014d523;
              goto LAB_0014d4ee;
            }
          }
          else {
LAB_0014d4ee:
            if (ublindf == (obj *)0x0) {
              bVar15 = false;
              goto LAB_0014d523;
            }
          }
          bVar15 = ublindf->oartifact == '\x1d';
          goto LAB_0014d523;
        }
        goto LAB_0014d56f;
      }
      bVar15 = (bool)((viz_array[mdef->my][mdef->mx] & 2U) >> 1);
      if ((magr == &youmonst) && ((viz_array[mdef->my][mdef->mx] & 2U) == 0)) goto LAB_0014d4b8;
LAB_0014d52c:
      if (bVar15 != false) {
        if (cVar1 == '\x03') {
          pcVar10 = hcolor("black");
          pcVar13 = mon_nam(mdef);
          pline("The %s blade draws the life from %s!",pcVar10,pcVar13);
        }
        else {
          pcVar10 = distant_name(otmp,xname);
          pcVar10 = The(pcVar10);
          pcVar13 = mon_nam(mdef);
          pline("%s draws the life from %s!",pcVar10,pcVar13);
          oprop_id(4,otmp,ostack,olaunch);
        }
      }
      if (mdef->m_lev == '\0') {
        *dmgptr = mdef->mhp * 2 + 200;
      }
      else {
        uVar6 = rnd(8);
        *dmgptr = *dmgptr + uVar6;
        mdef->mhpmax = mdef->mhpmax - uVar6;
        mdef->m_lev = mdef->m_lev + 0xff;
        if (1 < uVar6) {
          healup(uVar6 >> 1,0,'\0','\0');
        }
      }
    }
    else {
LAB_0014d523:
      if (mdef != &youmonst) goto LAB_0014d52c;
LAB_0014d56f:
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014d59c;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014d597;
LAB_0014d691:
        if (cVar1 == '\x03') {
          pcVar10 = hcolor("black");
          pcVar13 = "The %s blade drains your life!";
          goto LAB_0014d6ad;
        }
        pcVar10 = distant_name(otmp,xname);
        pcVar10 = The(pcVar10);
        pline("%s drains your life!",pcVar10);
        oprop_id(4,otmp,ostack,olaunch);
      }
      else {
LAB_0014d597:
        if (ublindf != (obj *)0x0) {
LAB_0014d59c:
          if (ublindf->oartifact == '\x1d') goto LAB_0014d691;
        }
        pcVar10 = "object";
        if (cVar1 == '\x03') {
          pcVar10 = "unholy blade";
        }
        pcVar13 = "You feel an %s drain your life!";
LAB_0014d6ad:
        pline(pcVar13,pcVar10);
      }
      losexp("life drainage");
      bVar15 = true;
      if (magr != (monst *)0x0) {
        iVar8 = magr->mhpmax;
        if (magr->mhp < iVar8) {
          iVar5 = (iVar5 - u.uhpmax) / 2 + magr->mhp;
          if (iVar8 <= iVar5) {
            iVar5 = iVar8;
          }
          magr->mhp = iVar5;
        }
      }
    }
    bVar23 = bVar15 != false || bVar23 != false;
  }
  if ((spec_applies_spfx_behead != '\0') &&
     ((bVar4 = spec_ability(otmp,0x400), bVar4 != '\0' ||
      (bVar4 = oprop_attack(8,otmp,olaunch,thrown), bVar4 != '\0')))) {
    if ((youattack != (magr != (monst *)0x0)) &&
       (bVar15 = true, (viz_array[magr->my][magr->mx] & 2U) != 0)) goto LAB_0014d848;
    if (mdef == &youmonst) {
      if (magr == &youmonst) goto LAB_0014d7fc;
LAB_0014d845:
      bVar15 = false;
    }
    else {
      bVar15 = (bool)((viz_array[mdef->my][mdef->mx] & 2U) >> 1);
      if ((magr == &youmonst) && ((viz_array[mdef->my][mdef->mx] & 2U) == 0)) {
LAB_0014d7fc:
        bVar15 = false;
        if (((u._1052_1_ & 1) != 0) && (bVar15 = false, u.ustuck == mdef)) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
              bVar15 = true;
              if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0014d848;
              goto LAB_0014d836;
            }
          }
          else {
LAB_0014d836:
            if (ublindf == (obj *)0x0) goto LAB_0014d845;
          }
          bVar15 = ublindf->oartifact == '\x1d';
        }
      }
    }
LAB_0014d848:
    pcVar13 = distant_name(otmp,xname);
    pcVar10 = local_138;
    snprintf(pcVar10,0x100,"%s %s",pcVar20,pcVar13);
    if (mdef == &youmonst) {
      pcVar20 = "you";
    }
    else {
      pcVar20 = mon_nam(mdef);
    }
    strcpy(hittee_1,pcVar20);
    if ((byte)(otmp->oclass | 4U) == 6) {
      if (((*(ushort *)&objects[otmp->otyp].field_0x11 & 1) == 0) ||
         (cVar1 = otmp->oartifact, dieroll != 1 || cVar1 == '\x04')) {
        if ((*(ushort *)&objects[otmp->otyp].field_0x11 & 1) == 0) goto LAB_0014d9a6;
        goto LAB_0014d9ba;
      }
      pcVar10 = local_138;
      if (cVar1 == '!') {
        pcVar10 = "The razor-sharp blade";
      }
      if (cVar1 == '\0') {
        oprop_id(8,otmp,ostack,olaunch);
      }
      if (((magr == &youmonst) && ((u._1052_1_ & 1) != 0)) && (u.ustuck == mdef)) {
        pcVar20 = mon_nam(mdef);
        pline("You slice %s wide open!",pcVar20);
        *dmgptr = mdef->mhp * 2 + 200;
        goto LAB_0014dcf2;
      }
      if (mdef == &youmonst) {
        if ((youmonst.data)->msize < 3) {
          piVar14 = &u.mh;
          if (u.umonnum == u.umonster) {
            piVar14 = &u.uhp;
          }
          *dmgptr = *piVar14 * 2 + 200;
          pline("%s cuts you in half!",pcVar10);
          goto LAB_0014de8d;
        }
        if (magr != (monst *)0x0) {
          pcVar10 = Monnam(magr);
        }
        pcVar20 = "%s cuts deeply into you!";
LAB_0014dc82:
        pline(pcVar20,pcVar10);
LAB_0014dc89:
        *dmgptr = *dmgptr << 1;
        goto LAB_0014dcf2;
      }
      if (notonhead == '\0') {
        if (2 < mdef->data->msize) {
          if (magr == &youmonst) {
            pcVar10 = mon_nam(mdef);
            pcVar20 = "You slice deeply into %s!";
            goto LAB_0014dc82;
          }
          if (bVar15 != false) {
            pcVar20 = Monnam(magr);
            pline("%s cuts deeply into %s!",pcVar20,hittee_1);
          }
          goto LAB_0014dc89;
        }
        *dmgptr = mdef->mhp * 2 + 200;
        pcVar13 = mon_nam(mdef);
        pcVar20 = "%s cuts %s in half!";
        goto LAB_0014de86;
      }
LAB_0014dba5:
      bVar17 = 0;
    }
    else {
LAB_0014d9a6:
      if ((dieroll == 1) || (mdef->data->mlet == '$')) {
LAB_0014d9d6:
        if (((magr == &youmonst) && ((u._1052_1_ & 1) != 0)) && (u.ustuck == mdef))
        goto LAB_0014dba5;
        bVar17 = otmp->oartifact;
        if (bVar17 == 0) {
          oprop_id(8,otmp,ostack,olaunch);
        }
        else if ((bVar17 == 0x14) || (bVar17 == 4)) {
          pcVar10 = artilist[bVar17].name;
        }
        if (mdef == &youmonst) {
          if ((short)(youmonst.data)->mflags1 < 0) {
            if (bVar23 != false) goto LAB_0014dba5;
            if (magr != (monst *)0x0) {
              pcVar10 = mon_nam(magr);
            }
            pline("Somehow, %s misses you wildly.",pcVar10);
            *dmgptr = 0;
          }
          else {
            if ((((youmonst.data)->mflags1 & 4) == 0) && ((youmonst.data)->mlet != '6')) {
              piVar14 = &u.mh;
              if (u.umonnum == u.umonster) {
                piVar14 = &u.uhp;
              }
              *dmgptr = *piVar14 * 2 + 200;
              uVar6 = mt_random();
              pcVar20 = *(char **)(artifact_hit_behead_behead_msg + (ulong)(uVar6 & 1) * 8);
              pcVar13 = "you";
              goto LAB_0014de86;
            }
            pcVar20 = body_part(0xb);
            pline("%s slices through your %s.",pcVar10,pcVar20);
          }
        }
        else {
          uVar6 = mdef->data->mflags1;
          if ((((short)uVar6 < 0) || (notonhead != '\0')) || ((u._1052_1_ & 1) != 0)) {
            if (bVar23 == false) {
              bVar17 = magr == &youmonst | bVar15;
              if (magr == &youmonst || bVar15 != false) {
                pcVar20 = "Somehow, %s misses wildly.";
                mtmp = magr;
                if (magr == &youmonst) {
                  pcVar20 = "Somehow, you miss %s wildly.";
                  mtmp = mdef;
                }
                pcVar10 = mon_nam(mtmp);
                pline(pcVar20,pcVar10);
              }
              *dmgptr = 0;
              goto LAB_0014dcf5;
            }
            goto LAB_0014dba5;
          }
          if (((uVar6 & 4) == 0) && (mdef->data->mlet != '6')) {
            *dmgptr = mdef->mhp * 2 + 200;
            uVar6 = mt_random();
            pcVar20 = *(char **)(artifact_hit_behead_behead_msg + (ulong)(uVar6 & 1) * 8);
            pcVar13 = mon_nam(mdef);
LAB_0014de86:
            pline(pcVar20,pcVar10,pcVar13);
LAB_0014de8d:
            if (otmp->oartifact == '\0') {
              return '\x01';
            }
            otmp->field_0x4a = otmp->field_0x4a | 0x20;
            return '\x01';
          }
          pcVar20 = mon_nam(mdef);
          pcVar20 = s_suffix(pcVar20);
          pcVar13 = mbodypart(mdef,0xb);
          pline("%s slices through %s %s.",pcVar10,pcVar20,pcVar13);
        }
LAB_0014dcf2:
        bVar17 = 1;
      }
      else {
LAB_0014d9ba:
        bVar17 = 0;
        if ((dieroll < 3) && (bVar17 = 0, otmp->oartifact == '\x04')) goto LAB_0014d9d6;
      }
    }
LAB_0014dcf5:
    bVar23 = (bool)(bVar23 != false | bVar17);
  }
  if (0x13 < (byte)otmp->oartifact) {
    return bVar23;
  }
  if ((0xce110U >> ((byte)otmp->oartifact & 0x1f) & 1) == 0) {
    return bVar23;
  }
  if (3 < dieroll) {
    return bVar23;
  }
  if ((*(uint *)&mdef->field_0x60 & 0x100) != 0) {
    return bVar23;
  }
  if ((!bVar22 && !bVar21) && (!bVar2 || !bVar3)) goto LAB_0014dde5;
  pcVar20 = distant_name(otmp,xname);
  pcVar20 = The(pcVar20);
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014dd86;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014dd81;
    pcVar10 = "shines brilliantly";
  }
  else {
LAB_0014dd81:
    if (ublindf == (obj *)0x0) {
      pcVar10 = "roars deafeningly";
    }
    else {
LAB_0014dd86:
      pcVar10 = "roars deafeningly";
      if (ublindf->oartifact == '\x1d') {
        pcVar10 = "shines brilliantly";
      }
    }
  }
  pline("%s %s as it strikes %s!",pcVar20,pcVar10,hittee);
LAB_0014dde5:
  cancel_monst(mdef,otmp,youattack,'\x01',magr == mdef);
  return '\x01';
}

Assistant:

boolean artifact_hit(
    struct monst *magr,
    struct monst *mdef,
    struct obj *otmp,
    struct obj *ostack,
    boolean thrown,
    int *dmgptr,
    int dieroll /* needed for Magicbane and vorpal blades */
    )
{
	boolean youattack = (magr == &youmonst);
	boolean youdefend = (mdef == &youmonst);
	boolean vis = (!youattack && magr && cansee(magr->mx, magr->my))
	    || (!youdefend && cansee(mdef->mx, mdef->my))
	    || (youattack && u.uswallow && mdef == u.ustuck && !Blind);
	boolean realizes_damage;
	boolean msg_printed = FALSE;
	const char *wepdesc;
	char hittee[BUFSZ];
	char wepbuf[BUFSZ];
	struct obj *olaunch = NULL;

	if (thrown) {
	    /* Launcher properties stack with fired ammunition,
	     * so get the launcher here if that's the case. */
	    if (youattack)
		olaunch = uwep;
	    else if (magr)
		olaunch = MON_WEP(magr);

	    if (olaunch && (!is_launcher(olaunch) ||
			    !ammo_and_launcher(otmp, olaunch)))
		olaunch = NULL;
	}

	/* Exit early if not an artifact or absent of attack properties. */
	if (!otmp->oartifact &&
	    !oprop_attack(ITEM_FIRE|ITEM_FROST|ITEM_DRLI|ITEM_VORPAL,
			  otmp, olaunch, thrown))
	    return FALSE;

	snprintf(wepbuf, BUFSZ, "%s %s", youattack ? "Your" : "The",
					 distant_name(otmp, xname));
	wepdesc = wepbuf;

	strcpy(hittee, youdefend ? "you" : mon_nam(mdef));

	/* The following takes care of most of the damage, but not all--
	 * the exception being for level draining, which is specially
	 * handled.  Messages are done in this function, however.
	 */
	*dmgptr += spec_dbon(otmp, olaunch, thrown, mdef, *dmgptr);

	if (youattack && youdefend) {
	    warning("attacking yourself with weapon?");
	    return FALSE;
	}

	realizes_damage = (youdefend || vis || 
			   /* feel the effect even if not seen */
			   (youattack && mdef == u.ustuck));

	/* the four basic attacks: fire, cold, shock and missiles */
	if (attacks(AD_FIRE, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_fire)) {
		if (otmp->oartifact == ART_FIRE_BRAND)
		    wepdesc = "The fiery blade";
		pline("%s %s %s%c",
			wepdesc,
			!spec_applies_ad_fire ? "hits" :
			(mdef->data == &mons[PM_WATER_ELEMENTAL]) ?
			"vaporizes part of" : "burns",
			hittee, !spec_applies_ad_fire ? '.' : '!');
		msg_printed = TRUE;
		if (spec_applies_ad_fire)
		    oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
	    }
	    if (!rn2(4)) {
		if (destroy_mitem(mdef, POTION_CLASS, AD_FIRE, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
		}
	    }
	    if (!rn2(4)) {
		if (destroy_mitem(mdef, SCROLL_CLASS, AD_FIRE, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
		}
	    }
	    if (!rn2(7)) {
		if (destroy_mitem(mdef, SPBOOK_CLASS, AD_FIRE, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
		}
	    }
	    if (youdefend && Slimed) {
		burn_away_slime();
		oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
	    }
	}

	if (attacks(AD_COLD, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_cold)) {
		if (otmp->oartifact == ART_FROST_BRAND)
		    wepdesc = "The ice-cold blade";
		pline("%s %s %s%c",
			wepdesc,
			!spec_applies_ad_cold ? "hits" : "freezes",
			hittee, !spec_applies_ad_cold ? '.' : '!');
		msg_printed = TRUE;
		if (spec_applies_ad_cold)
		    oprop_id(ITEM_FROST, otmp, ostack, olaunch);
	    }
	    if (!rn2(4)) {
		if (destroy_mitem(mdef, POTION_CLASS, AD_COLD, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FROST, otmp, ostack, olaunch);
		}
	    }
	}

	if (attacks(AD_ELEC, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_elec)) {
		pline("The massive hammer hits%s %s%c",
			  !spec_applies_ad_elec ? "" : "!  Lightning strikes",
			  hittee, !spec_applies_ad_elec ? '.' : '!');
		msg_printed = TRUE;
	    }
	    if (!rn2(5)) destroy_mitem(mdef, WAND_CLASS, AD_ELEC, dmgptr);
	}

	if (attacks(AD_MAGM, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_magm)) {
		pline("The imaginary widget hits%s %s%c",
			  !spec_applies_ad_magm ? "" :
				"!  A hail of magic missiles strikes",
			  hittee, !spec_applies_ad_magm ? '.' : '!');
		msg_printed = TRUE;
	    }
	}

	if (attacks(AD_STUN, otmp, olaunch, thrown) && dieroll <= MB_MAX_DIEROLL) {
	    /* Magicbane's special attacks (possibly modifies hittee[]) */
	    msg_printed = magicbane_hit(magr, mdef, otmp, dmgptr, dieroll, vis,
					hittee) || msg_printed;
	}

	if (otmp->oartifact != ART_THIEFBANE || !youdefend) {
	    if (!spec_dbon_applies &&
		!spec_applies_ad_drli && !spec_applies_spfx_behead) {
		/* since damage bonus didn't apply, nothing more to do;
		   no further attacks have side-effects on inventory */
		return msg_printed;
	    }
	}

	/* Stormbringer or thirsty weapon */
	if (spec_applies_ad_drli &&
	    (spec_ability(otmp, SPFX_DRLI) ||
	     oprop_attack(ITEM_DRLI, otmp, olaunch, thrown))) {
	    msg_printed = artifact_hit_drainlife(magr, mdef, otmp, ostack, olaunch,
						 dmgptr) || msg_printed;
	}

	/* Thiefbane, Tsurugi of Muramasa, Vorpal Blade or vorpal weapon */
	if (spec_applies_spfx_behead &&
	    (spec_ability(otmp, SPFX_BEHEAD) ||
	     oprop_attack(ITEM_VORPAL, otmp, olaunch, thrown))) {
	    boolean beheaded;
	    msg_printed = artifact_hit_behead(magr, mdef, otmp, ostack, olaunch,
					      dmgptr, dieroll, msg_printed,
					      &beheaded) || msg_printed;
	    /* No further effects if the monster was instakilled. */
	    if (beheaded)
		return msg_printed;
	}

	/* WAC -- 1/6 chance of cancellation with foobane weapons */
	if (otmp->oartifact == ART_ORCRIST ||
	    otmp->oartifact == ART_DRAGONBANE ||
	    otmp->oartifact == ART_DEMONBANE ||
	    otmp->oartifact == ART_WEREBANE ||
	    otmp->oartifact == ART_TROLLSBANE ||
	    otmp->oartifact == ART_THIEFBANE ||
	    otmp->oartifact == ART_OGRESMASHER) {
		if (!mdef->mcan && dieroll < 4) {
		    if (realizes_damage) {
			pline("%s %s as it strikes %s!",
			      The(distant_name(otmp, xname)),
			      Blind ? "roars deafeningly" : "shines brilliantly",
			      hittee);
		    }
		    cancel_monst(mdef, otmp, youattack, TRUE, magr == mdef);
		    msg_printed = TRUE;
		}
	}

	return msg_printed;
}